

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaParseWildcardNs
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaWildcardPtr wildc,
              xmlNodePtr node)

{
  int iVar1;
  xmlChar *str1;
  xmlNodePtr node_00;
  byte *str1_00;
  xmlHashTablePtr pxVar2;
  xmlAttrPtr attr;
  xmlSchemaTypePtr value;
  int *piVar3;
  xmlSchemaWildcardNsPtr pxVar4;
  undefined4 uVar5;
  char *in_R8;
  int *piVar6;
  long lVar7;
  xmlChar *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar8;
  xmlSchemaWildcardNsPtr local_48;
  
  str1 = xmlSchemaGetProp(ctxt,(xmlNodePtr)wildc,"processContents");
  iVar8 = 0;
  uVar5 = 3;
  if ((str1 != (xmlChar *)0x0) && (iVar1 = xmlStrEqual(str1,(xmlChar *)"strict"), iVar1 == 0)) {
    iVar1 = xmlStrEqual(str1,(xmlChar *)"skip");
    uVar5 = 1;
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(str1,(xmlChar *)"lax");
      uVar5 = 2;
      if (iVar1 == 0) {
        in_R8 = "(strict | skip | lax)";
        iVar8 = 0xbdd;
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)wildc,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(strict | skip | lax)",(char *)str1,
                   (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,
                   (xmlChar *)CONCAT44(0xbdd,in_stack_ffffffffffffffb0));
        uVar5 = 3;
      }
    }
  }
  *(undefined4 *)&schema->annot = uVar5;
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)wildc,"namespace");
  str1_00 = xmlSchemaGetNodeContent(ctxt,node_00);
  if ((node_00 == (xmlNodePtr)0x0) || (iVar1 = xmlStrEqual(str1_00,(xmlChar *)"##any"), iVar1 != 0))
  {
    *(undefined4 *)((long)&schema->annot + 4) = 1;
  }
  else {
    iVar1 = xmlStrEqual(str1_00,(xmlChar *)"##other");
    if (iVar1 == 0) {
      piVar6 = &schema->flags;
      local_48 = (xmlSchemaWildcardNsPtr)0x0;
      do {
        while (((ulong)*str1_00 < 0x21 && ((0x100002600U >> ((ulong)*str1_00 & 0x3f) & 1) != 0))) {
          str1_00 = str1_00 + 1;
        }
        lVar7 = 0;
        while ((0x20 < (ulong)str1_00[lVar7] ||
               ((0x100002601U >> ((ulong)str1_00[lVar7] & 0x3f) & 1) == 0))) {
          lVar7 = lVar7 + 1;
        }
        if (lVar7 == 0) {
          return iVar8;
        }
        attr = (xmlAttrPtr)xmlStrndup(str1_00,(int)lVar7);
        iVar1 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##other");
        pxVar4 = local_48;
        if ((iVar1 == 0) && (iVar1 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##any"), iVar1 == 0)) {
          iVar1 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##targetNamespace");
          piVar3 = piVar6;
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##local");
            if (iVar1 == 0) {
              value = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
              xmlSchemaPValAttrNodeValue
                        (ctxt,(xmlSchemaBasicItemPtr)node_00,attr,(xmlChar *)value,
                         (xmlSchemaTypePtr)in_R8);
              pxVar2 = (xmlHashTablePtr)xmlDictLookup(ctxt->dict,(xmlChar *)attr,-1);
            }
            else {
              pxVar2 = (xmlHashTablePtr)0x0;
            }
          }
          else {
            pxVar2 = (xmlHashTablePtr)ctxt->targetNamespace;
          }
          do {
            piVar3 = *(int **)piVar3;
            if (piVar3 == (int *)0x0) {
              pxVar4 = xmlSchemaNewWildcardNsConstraint(ctxt);
              if (pxVar4 == (xmlSchemaWildcardNsPtr)0x0) {
                (*xmlFree)(attr);
                goto LAB_001bbba7;
              }
              pxVar4->value = (xmlChar *)pxVar2;
              pxVar4->next = (_xmlSchemaWildcardNs *)0x0;
              if (*(long *)piVar6 == 0) {
                *(xmlSchemaWildcardNsPtr *)piVar6 = pxVar4;
              }
              else if (local_48 != (xmlSchemaWildcardNsPtr)0x0) {
                local_48->next = pxVar4;
              }
              break;
            }
          } while (pxVar2 != *(xmlHashTablePtr *)(piVar3 + 2));
        }
        else {
          iVar8 = 0x700;
          in_R8 = "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))";
          xmlSchemaPSimpleTypeErr
                    (ctxt,XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,(xmlSchemaBasicItemPtr)node_00,
                     (xmlNodePtr)0x0,
                     (xmlSchemaTypePtr)
                     "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))",
                     (char *)attr,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,
                     (xmlChar *)CONCAT44(0x700,in_stack_ffffffffffffffb0));
        }
        local_48 = pxVar4;
        str1_00 = str1_00 + lVar7;
        (*xmlFree)(attr);
      } while (*str1_00 != 0);
    }
    else {
      pxVar2 = (xmlHashTablePtr)xmlSchemaNewWildcardNsConstraint(ctxt);
      schema->typeDecl = pxVar2;
      if (pxVar2 == (xmlHashTablePtr)0x0) {
LAB_001bbba7:
        iVar8 = -1;
      }
      else {
        *(xmlChar **)&pxVar2->size = ctxt->targetNamespace;
      }
    }
  }
  return iVar8;
}

Assistant:

static int
xmlSchemaParseWildcardNs(xmlSchemaParserCtxtPtr ctxt,
			 xmlSchemaPtr schema ATTRIBUTE_UNUSED,
			 xmlSchemaWildcardPtr wildc,
			 xmlNodePtr node)
{
    const xmlChar *pc, *ns, *dictnsItem;
    int ret = 0;
    xmlChar *nsItem;
    xmlSchemaWildcardNsPtr tmp, lastNs = NULL;
    xmlAttrPtr attr;

    pc = xmlSchemaGetProp(ctxt, node, "processContents");
    if ((pc == NULL)
        || (xmlStrEqual(pc, (const xmlChar *) "strict"))) {
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
    } else if (xmlStrEqual(pc, (const xmlChar *) "skip")) {
        wildc->processContents = XML_SCHEMAS_ANY_SKIP;
    } else if (xmlStrEqual(pc, (const xmlChar *) "lax")) {
        wildc->processContents = XML_SCHEMAS_ANY_LAX;
    } else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, node,
	    NULL, "(strict | skip | lax)", pc,
	    NULL, NULL, NULL);
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
    }
    /*
     * Build the namespace constraints.
     */
    attr = xmlSchemaGetPropNode(node, "namespace");
    ns = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if ((attr == NULL) || (xmlStrEqual(ns, BAD_CAST "##any")))
	wildc->any = 1;
    else if (xmlStrEqual(ns, BAD_CAST "##other")) {
	wildc->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (wildc->negNsSet == NULL) {
	    return (-1);
	}
	wildc->negNsSet->value = ctxt->targetNamespace;
    } else {
	const xmlChar *end, *cur;

	cur = ns;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    nsItem = xmlStrndup(cur, end - cur);
	    if ((xmlStrEqual(nsItem, BAD_CAST "##other")) ||
		    (xmlStrEqual(nsItem, BAD_CAST "##any"))) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,
		    NULL, (xmlNodePtr) attr,
		    NULL,
		    "((##any | ##other) | List of (xs:anyURI | "
		    "(##targetNamespace | ##local)))",
		    nsItem, NULL, NULL, NULL);
		ret = XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER;
	    } else {
		if (xmlStrEqual(nsItem, BAD_CAST "##targetNamespace")) {
		    dictnsItem = ctxt->targetNamespace;
		} else if (xmlStrEqual(nsItem, BAD_CAST "##local")) {
		    dictnsItem = NULL;
		} else {
		    /*
		    * Validate the item (anyURI).
		    */
		    xmlSchemaPValAttrNodeValue(ctxt, NULL, attr,
			nsItem, xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI));
		    dictnsItem = xmlDictLookup(ctxt->dict, nsItem, -1);
		}
		/*
		* Avoid duplicate namespaces.
		*/
		tmp = wildc->nsSet;
		while (tmp != NULL) {
		    if (dictnsItem == tmp->value)
			break;
		    tmp = tmp->next;
		}
		if (tmp == NULL) {
		    tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
		    if (tmp == NULL) {
			xmlFree(nsItem);
			return (-1);
		    }
		    tmp->value = dictnsItem;
		    tmp->next = NULL;
		    if (wildc->nsSet == NULL)
			wildc->nsSet = tmp;
		    else if (lastNs != NULL)
			lastNs->next = tmp;
		    lastNs = tmp;
		}

	    }
	    xmlFree(nsItem);
	    cur = end;
	} while (*cur != 0);
    }
    return (ret);
}